

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::InitBoxedInlineSegments<Js::JavascriptArray>
          (JavascriptArray *this,JavascriptArray *instance,bool deepCopy)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  code *pcVar4;
  bool bVar5;
  DynamicObjectFlags DVar6;
  DynamicObjectFlags e1;
  SparseArraySegmentBase **ppSVar7;
  uint *puVar8;
  Recycler *pRVar9;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  SparseArraySegmentBase *pSVar10;
  undefined4 *puVar11;
  nullptr_t local_60 [3];
  undefined1 local_48 [8];
  AutoDisableInterrupt failFastError;
  uint inlineChunkSize;
  uint32 sourceSize;
  SparseArraySegment<void_*> *dst;
  SparseArraySegment<void_*> *src;
  bool deepCopy_local;
  JavascriptArray *instance_local;
  JavascriptArray *this_local;
  
  DVar6 = GetFlags(this);
  e1 = operator~(HasSegmentMap);
  DVar6 = Js::operator&(DVar6,e1);
  SetFlags(this,DVar6);
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&instance->head);
  dst = SparseArraySegment<void_*>::From(*ppSVar7);
  failFastError._12_4_ = (dst->super_SparseArraySegmentBase).size;
  bVar5 = IsInlineSegment(&dst->super_SparseArraySegmentBase,instance);
  if (bVar5) {
    _inlineChunkSize =
         &DetermineInlineHeadSegmentPointer<Js::JavascriptArray,0u,true>(this)->
          super_SparseArraySegmentBase;
    ((SparseArraySegmentBase *)&_inlineChunkSize->left)->left =
         (dst->super_SparseArraySegmentBase).left;
    _inlineChunkSize->length = (dst->super_SparseArraySegmentBase).length;
    failFastError.m_operationCompleted = true;
    failFastError.m_interruptDisableState = false;
    failFastError.m_explicitCompletion = false;
    failFastError._11_1_ = 0;
    puVar8 = min<unsigned_int>(&(dst->super_SparseArraySegmentBase).size,
                               (uint *)&failFastError.m_operationCompleted);
    _inlineChunkSize->size = *puVar8;
    failFastError._12_4_ = _inlineChunkSize->size;
  }
  else {
    pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    uVar1 = (dst->super_SparseArraySegmentBase).left;
    uVar2 = (dst->super_SparseArraySegmentBase).length;
    uVar3 = (dst->super_SparseArraySegmentBase).size;
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&(dst->super_SparseArraySegmentBase).next);
    _inlineChunkSize =
         &SparseArraySegment<void_*>::AllocateSegment(pRVar9,uVar1,uVar2,uVar3,*ppSVar7)->
          super_SparseArraySegmentBase;
  }
  SetHeadAndLastUsedSegment(this,_inlineChunkSize);
  SparseArraySegmentBase::CheckLengthvsSize(_inlineChunkSize);
  bVar5 = IsInlineSegment(&dst->super_SparseArraySegmentBase,instance);
  if ((bVar5) && (bVar5 = IsInlineSegment(_inlineChunkSize,this), !bVar5)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f06,
                                "(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)))"
                                ,
                                "!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this))"
                               );
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  Memory::CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((WriteBarrierPtr<void> *)(_inlineChunkSize + 1),(ulong)_inlineChunkSize->size,
             (WriteBarrierPtr<void> *)(&dst->super_SparseArraySegmentBase + 1),
             (ulong)(uint)failFastError._12_4_);
  if (deepCopy) {
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    threadContext = ScriptContext::GetThreadContext(this_00);
    AutoDisableInterrupt::AutoDisableInterrupt((AutoDisableInterrupt *)local_48,threadContext,true);
    do {
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&(dst->super_SparseArraySegmentBase).next);
      if (*ppSVar7 == (SparseArraySegmentBase *)0x0) {
        local_60[0] = (nullptr_t)0x0;
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                  (&_inlineChunkSize->next,local_60);
        _inlineChunkSize = (SparseArraySegmentBase *)0x0;
      }
      else {
        ppSVar7 = Memory::PointerValue<Js::SparseArraySegmentBase>
                            (&(dst->super_SparseArraySegmentBase).next);
        dst = (SparseArraySegment<void_*> *)*ppSVar7;
        pRVar9 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        uVar1 = ((SparseArraySegmentBase *)dst)->left;
        uVar2 = ((SparseArraySegmentBase *)dst)->length;
        uVar3 = ((SparseArraySegmentBase *)dst)->size;
        ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&((SparseArraySegmentBase *)dst)->next);
        pSVar10 = &SparseArraySegment<void_*>::AllocateSegment(pRVar9,uVar1,uVar2,uVar3,*ppSVar7)->
                   super_SparseArraySegmentBase;
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                  (&_inlineChunkSize->next,pSVar10);
        ppSVar7 = Memory::PointerValue<Js::SparseArraySegmentBase>(&_inlineChunkSize->next);
        _inlineChunkSize = *ppSVar7;
        Memory::
        CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  ((WriteBarrierPtr<void> *)(_inlineChunkSize + 1),(ulong)_inlineChunkSize->size,
                   (WriteBarrierPtr<void> *)((SparseArraySegmentBase *)dst + 1),
                   (ulong)((SparseArraySegmentBase *)dst)->size);
      }
    } while (_inlineChunkSize != (SparseArraySegmentBase *)0x0);
    AutoDisableInterrupt::Completed((AutoDisableInterrupt *)local_48);
    AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_48);
  }
  else {
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&_inlineChunkSize->next,&(dst->super_SparseArraySegmentBase).next);
  }
  pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pSVar10->next);
  if (*ppSVar7 != (SparseArraySegmentBase *)0x0) {
    pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&pSVar10->next);
    pSVar10 = *ppSVar7;
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&(dst->super_SparseArraySegmentBase).next);
    if ((pSVar10 == *ppSVar7) && (deepCopy)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2f2f,
                                  "(this->head->next == nullptr || this->head->next != src->next || !deepCopy)"
                                  ,
                                  "this->head->next == nullptr || this->head->next != src->next || !deepCopy"
                                 );
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  return;
}

Assistant:

void JavascriptArray::InitBoxedInlineSegments(T * instance, bool deepCopy)
    {
        // Don't copy the segment map, we will build it again
        SetFlags(GetFlags() & ~DynamicObjectFlags::HasSegmentMap);

        SparseArraySegment<typename T::TElement>* src = SparseArraySegment<typename T::TElement>::From(instance->head);
        SparseArraySegment<typename T::TElement>* dst;

        uint32 sourceSize = src->size;
        if (IsInlineSegment(src, instance))
        {
            // Copy head segment data between inlined head segments
            dst = DetermineInlineHeadSegmentPointer<T, 0, true>(static_cast<T*>(this));
            dst->left = src->left;
            dst->length = src->length;
            uint inlineChunkSize = SparseArraySegmentBase::INLINE_CHUNK_SIZE;
            dst->size = min(src->size, inlineChunkSize);
            sourceSize = dst->size;
        }
        else
        {
            // Otherwise, ensure that the new head segment is allocated now in the recycler so that the data can be copied.
            // Note: src->next is provided to control whether a leaf segment is allocated just as it is with instance. If
            //  src->next is non-null, the appropriate update to dst->next will continue below.
            dst = SparseArraySegment<typename T::TElement>::AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
        }

        SetHeadAndLastUsedSegment(dst);
        dst->CheckLengthvsSize();

        Assert(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)));

        CopyArray(dst->elements, dst->size, src->elements, sourceSize);

        if (!deepCopy)
        {
            // Without a deep copy, point to the existing next segment from the original instance
            dst->next = src->next;
        }
        else
        {
            // When deepCopy is true, make a separate copy of each segment. While this involves data
            // duplication, it allows the new object to have a separate lifetime without sharing data.
            AutoDisableInterrupt failFastError(GetScriptContext()->GetThreadContext());
            do
            {
                if (src->next != nullptr)
                {
                    // Allocate a new segment in the destination and copy from src
                    // note: PointerValue is to strip SWB wrapping before static_cast
                    src = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(src->next));

                    dst->next = dst->AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
                    dst = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(dst->next));

                    CopyArray(dst->elements, dst->size, src->elements, src->size);
                }
                else
                {
                    // Terminate the loop
                    dst->next = nullptr;
                    dst = nullptr;
                }
            } while (dst != nullptr);
            failFastError.Completed();
        }

        // Assert either
        // - there is only the head segment
        // - the new head segment points to a new next segment
        // - the new head segment points to the existing next segment because this is not a deepCopy
        Assert(this->head->next == nullptr || this->head->next != src->next || !deepCopy);
    }